

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

void __thiscall
helics::PublicationInfo::setProperty(PublicationInfo *this,int32_t option,int32_t value)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  bool bVar1;
  bool bvalue;
  undefined4 in_stack_ffffffffffffffd8;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = in_EDX != 0;
  if (in_ESI == 0x18d) {
    *(bool *)(in_RDI + 0xea) = bVar1;
  }
  else if (in_ESI == 0x192) {
    *(byte *)(in_RDI + 0xea) = (bVar1 ^ 0xffU) & 1;
  }
  else if (in_ESI == 0x197) {
    *(uint *)(in_RDI + 0xec) = (uint)bVar1;
  }
  else if (in_ESI == 0x199) {
    *(uint *)(in_RDI + 0xec) = (uint)bVar1;
  }
  else if (in_ESI == 0x19b) {
    *(bool *)(in_RDI + 0xeb) = bVar1;
  }
  else if (in_ESI == 0x1c4) {
    *(bool *)(in_RDI + 0xe9) = bVar1;
  }
  else if (in_ESI == 0x20a) {
    *(int *)(in_RDI + 0xec) = in_EDX;
  }
  else if (in_ESI == 0x22d) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              (in_stack_ffffffffffffffe0,CONCAT44(0x22d,in_stack_ffffffffffffffd8),
               (time_units)((ulong)in_RDI >> 0x20));
    *(TimeRepresentation<count_time<9,_long>_> **)(in_RDI + 0xf0) = in_stack_ffffffffffffffe0;
  }
  return;
}

Assistant:

void PublicationInfo::setProperty(int32_t option, int32_t value)
{
    bool bvalue = (value != 0);
    switch (option) {
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            only_update_on_change = bvalue;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            required = bvalue;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            required = !bvalue;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            requiredConnections = bvalue ? 1 : 0;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            requiredConnections = !bvalue ? 0 : 1;
            break;
        case defs::Options::BUFFER_DATA:
            buffer_data = bvalue;
            break;
        case defs::Options::CONNECTIONS:
            requiredConnections = value;
            break;
        case defs::Options::TIME_RESTRICTED:
            minTimeGap = Time(value, time_units::ms);
            break;
        default:
            break;
    }
}